

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::ParsedExpression,duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
          (duckdb *this,ExpressionType *args,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *args_1)

{
  ExpressionType type;
  OperatorExpression *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  
  this_00 = (OperatorExpression *)operator_new(0x50);
  type = *args;
  local_28._M_head_impl =
       (args_1->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (args_1->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  local_30._M_head_impl = (ParsedExpression *)0x0;
  OperatorExpression::OperatorExpression
            (this_00,type,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_28,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_30);
  *(OperatorExpression **)this = this_00;
  if (local_30._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_30._M_head_impl = (ParsedExpression *)0x0;
  if (local_28._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}